

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_tracer.h
# Opt level: O3

stepping_variable __thiscall
AbstractIsolineTracer<double>::determine_integration_type(AbstractIsolineTracer<double> *this)

{
  double *pdVar1;
  double dVar2;
  double *pdVar3;
  stepping_variable sVar4;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  double *pdVar5;
  CoolPropBaseError *this_00;
  stepping_variable sVar6;
  double *pdVar7;
  double dVar8;
  double dVar9;
  string local_38;
  
  sVar4 = this->mode;
  if (this->mode == STEP_INVALID) {
    if (this->imposed_variable == IMPOSED_P) {
      dVar8 = this->imposed_value;
      pdVar5 = (this->pc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (this->pc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar7 = pdVar5 + 1;
      sVar6 = STEP_IN_T;
      if (pdVar7 != pdVar1 && pdVar5 != pdVar1) {
        dVar9 = *pdVar5;
        do {
          dVar2 = *pdVar7;
          pdVar3 = pdVar7;
          if (*pdVar7 <= dVar9) {
            dVar2 = dVar9;
            pdVar3 = pdVar5;
          }
          pdVar5 = pdVar3;
          dVar9 = dVar2;
          pdVar7 = pdVar7 + 1;
        } while (pdVar7 != pdVar1);
      }
    }
    else {
      if (this->imposed_variable != IMPOSED_T) {
        this_00 = (CoolPropBaseError *)__cxa_allocate_exception(0x30);
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"Invalid imposed variable","");
        CoolProp::CoolPropBaseError::CoolPropBaseError(this_00,&local_38,eValue);
        *(undefined ***)this_00 = &PTR__CoolPropBaseError_001ac058;
        __cxa_throw(this_00,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::
                             typeinfo,CoolProp::CoolPropBaseError::~CoolPropBaseError);
      }
      dVar8 = this->imposed_value;
      this->m_T = dVar8;
      pdVar5 = (this->Tc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar1 = (this->Tc).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar7 = pdVar5 + 1;
      sVar6 = STEP_IN_P;
      if (pdVar7 != pdVar1 && pdVar5 != pdVar1) {
        dVar9 = *pdVar5;
        do {
          dVar2 = *pdVar7;
          pdVar3 = pdVar7;
          if (dVar9 <= *pdVar7) {
            dVar2 = dVar9;
            pdVar3 = pdVar5;
          }
          pdVar5 = pdVar3;
          dVar9 = dVar2;
          pdVar7 = pdVar7 + 1;
        } while (pdVar7 != pdVar1);
      }
    }
    sVar4 = STEP_IN_RHO0;
    if (*pdVar5 <= dVar8) {
      sVar4 = sVar6;
    }
  }
  return sVar4;
}

Assistant:

virtual stepping_variable determine_integration_type() {

        // If already specified, override the default logic
        if (this->mode != STEP_INVALID) {
            return this->mode;
        }

        stepping_variable mode;
        if (imposed_variable == IMPOSED_T) {
            m_T = imposed_value;
            if (m_T < *std::min_element(Tc.cbegin(), Tc.cend())) {
                // This is a subcritical isotherm, T is less than both critical temperatures
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_P;
            }
        }
        else if (imposed_variable == IMPOSED_P) {
            if (imposed_value < *std::max_element(pc.cbegin(), pc.cend())) {
                // This is a subcritical isobar, p is less than both critical pressures. Therefore
                // we will step in the concentration of one of the components of the binary. 
                mode = AbstractIsolineTracer::STEP_IN_RHO0;
            }
            else {
                mode = AbstractIsolineTracer::STEP_IN_T;
            }
        }
        else {
            throw ValueError("Invalid imposed variable");
        }
        return mode;
    }